

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-opt.h
# Opt level: O1

void __thiscall
mp::TypedSolverOption<int>::Parse(TypedSolverOption<int> *this,char **s,bool splitString)

{
  uint uVar1;
  
  uVar1 = internal::OptionHelper<int>::Parse(s,splitString);
  (*(this->super_SolverOption)._vptr_SolverOption[10])(this,(ulong)uVar1);
  return;
}

Assistant:

void Parse(const char *&s, bool splitString=false) override {
    const char *start = s;
    T value;
    try {
      value = internal::OptionHelper<T>::Parse(s, splitString);
    } catch (const std::exception& exc) {
      // undocumented: we accept next option after a numeric option
      s = SkipNonSpaces(s);
      throw InvalidOptionValue(name(),
                               std::string(start, s - start),
                               exc.what());
    }
    SetValue(value);
  }